

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python.cc
# Opt level: O2

bool __thiscall flatbuffers::python::Version::IsValid(Version *this)

{
  bool bVar1;
  
  bVar1 = false;
  if (((ushort)this->major < 4) && (bVar1 = false, this->major != 1)) {
    if (this->minor < 0) {
      return false;
    }
    bVar1 = -1 < this->micro;
  }
  return bVar1;
}

Assistant:

bool Version::IsValid() const {
  return (major == 0 || major == 2 || major == 3) && minor >= 0 && micro >= 0;
}